

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyboard.cpp
# Opt level: O2

bool __thiscall
Inputs::Keyboard::set_key_pressed(Keyboard *this,Key key,char param_2,bool is_pressed,bool param_4)

{
  Delegate *pDVar1;
  int iVar2;
  ulong *puVar3;
  ulong uVar4;
  reference rVar5;
  
  uVar4 = (ulong)(int)key;
  if ((ulong)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= uVar4) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->key_states_,uVar4 + 1,false);
  }
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->key_states_,uVar4);
  puVar3 = rVar5._M_p;
  if (is_pressed) {
    uVar4 = rVar5._M_mask | *puVar3;
  }
  else {
    uVar4 = ~rVar5._M_mask & *puVar3;
  }
  *puVar3 = uVar4;
  pDVar1 = this->delegate_;
  if (pDVar1 != (Delegate *)0x0) {
    iVar2 = (**pDVar1->_vptr_Delegate)(pDVar1,this,key,(ulong)is_pressed);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool Keyboard::set_key_pressed(Key key, char, bool is_pressed, bool) {
	const size_t key_offset = size_t(key);
	if(key_offset >= key_states_.size()) {
		key_states_.resize(key_offset+1, false);
	}
	key_states_[key_offset] = is_pressed;

	if(delegate_) return delegate_->keyboard_did_change_key(this, key, is_pressed);
	return false;
}